

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O2

uint16_t __thiscall
duckdb::roaring::ContainerSegmentScan::operator++(ContainerSegmentScan *this,int param_1)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  
  bVar1 = this->index;
  uVar2 = (ulong)bVar1;
  bVar4 = this->count;
  uVar3 = 8;
  if (8 < bVar1) {
    uVar3 = (uint)bVar1;
  }
  do {
    if (7 < uVar2) {
LAB_0049ea13:
      this->count = bVar4 + 1;
      return (uint16_t)((uVar3 & 0xff) << 8);
    }
    if (bVar4 < this->segments[uVar2]) {
      uVar3 = (uint)uVar2;
      goto LAB_0049ea13;
    }
    this->count = '\0';
    uVar2 = uVar2 + 1;
    this->index = (uint8_t)uVar2;
    bVar4 = 0;
  } while( true );
}

Assistant:

uint16_t ContainerSegmentScan::operator++(int) {
	while (index < COMPRESSED_SEGMENT_COUNT && count >= segments[index]) {
		count = 0;
		index++;
	}
	count++;

	// index == COMPRESSED_SEGMENT_COUNT is allowed for runs, as the last run could end at ROARING_CONTAINER_SIZE
	D_ASSERT(index <= COMPRESSED_SEGMENT_COUNT);
	if (index < COMPRESSED_SEGMENT_COUNT) {
		D_ASSERT(segments[index] != 0);
	}
	uint16_t base = static_cast<uint16_t>(index) * COMPRESSED_SEGMENT_SIZE;
	return base;
}